

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_2b0a42::t_debugger::f_print_sequence<xemmai::t_tuple>
          (t_debugger *this,t_object *a_value,size_t a_depth)

{
  ulong uVar1;
  size_t sVar2;
  t_svalue *ptVar3;
  t_value<xemmai::t_pointer> local_50;
  ulong local_40;
  size_t i;
  t_tuple *local_28;
  t_tuple *sequence;
  size_t a_depth_local;
  t_object *a_value_local;
  t_debugger *this_local;
  
  sequence = (t_tuple *)a_depth;
  a_depth_local = (size_t)a_value;
  a_value_local = (t_object *)this;
  local_28 = xemmai::t_object::f_as<xemmai::t_tuple>(a_value);
  if (sequence == (t_tuple *)0x0) {
    fputs("...",(FILE *)this->v_out);
  }
  else {
    sVar2 = xemmai::t_tuple::f_size(local_28);
    if (sVar2 != 0) {
      ptVar3 = xemmai::t_tuple::operator[](local_28,0);
      xemmai::t_value<xemmai::t_pointer>::t_value<xemmai::t_slot>
                ((t_value<xemmai::t_pointer> *)&i,ptVar3);
      f_print_value(this,(t_pvalue *)&i,(size_t)sequence);
      for (local_40 = 1; uVar1 = local_40, sVar2 = xemmai::t_tuple::f_size(local_28), uVar1 < sVar2;
          local_40 = local_40 + 1) {
        fputs(", ",(FILE *)this->v_out);
        ptVar3 = xemmai::t_tuple::operator[](local_28,local_40);
        xemmai::t_value<xemmai::t_pointer>::t_value<xemmai::t_slot>(&local_50,ptVar3);
        f_print_value(this,&local_50,(size_t)sequence);
      }
    }
  }
  return;
}

Assistant:

void f_print_sequence(t_object* a_value, size_t a_depth)
	{
		auto& sequence = a_value->f_as<T>();
		if (a_depth <= 0) {
			std::fputs("...", v_out);
		} else if (sequence.f_size() > 0) {
			f_print_value(sequence[0], a_depth);
			for (size_t i = 1; i < sequence.f_size(); ++i) {
				std::fputs(", ", v_out);
				f_print_value(sequence[i], a_depth);
			}
		}
	}